

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O0

void __thiscall
slang::ast::Delay3Control::visitExprs<netlist::VariableReferenceVisitor&>
          (Delay3Control *this,VariableReferenceVisitor *visitor)

{
  Expression *in_RSI;
  VariableReferenceVisitor *in_RDI;
  
  Expression::visit<netlist::VariableReferenceVisitor&>(in_RSI,in_RDI);
  if ((in_RDI->varList).
      super__Vector_base<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    Expression::visit<netlist::VariableReferenceVisitor&>(in_RSI,in_RDI);
  }
  if ((in_RDI->selectors).
      super__Vector_base<const_slang::ast::Expression_*,_std::allocator<const_slang::ast::Expression_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    Expression::visit<netlist::VariableReferenceVisitor&>(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr1.visit(visitor);
        if (expr2)
            expr2->visit(visitor);
        if (expr3)
            expr3->visit(visitor);
    }